

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.cpp
# Opt level: O2

bool Grammar::is_set_type(string *str)

{
  bool bVar1;
  allocator local_5a;
  allocator local_59;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"Set<",&local_59);
  bVar1 = str_utils::starts_with(str,&local_38);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_58,">",&local_5a);
    bVar1 = str_utils::ends_with(str,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
    if (bVar1) {
      std::__cxx11::string::substr((ulong)&local_58,(ulong)str);
      str_utils::trim(&local_38,&local_58);
      bVar1 = is_object_type(&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      std::__cxx11::string::~string((string *)&local_58);
      return bVar1;
    }
  }
  else {
    std::__cxx11::string::~string((string *)&local_38);
  }
  return false;
}

Assistant:

bool Grammar::is_set_type(const std::string& str) {
    if (!str_utils::starts_with(str, "Set<") || !str_utils::ends_with(str, ">"))
        return false;
    return is_object_type(str_utils::trim(str.substr(4, int(str.size()) - 5)));
}